

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

bool rapidjson::UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
               (GenericStringStream<rapidjson::UTF8<char>_> *is,uint *codepoint)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  pbVar2 = (byte *)is->src_;
  is->src_ = (Ch *)(pbVar2 + 1);
  bVar4 = *pbVar2;
  if (-1 < (char)bVar4) {
    *codepoint = (uint)bVar4;
    bVar3 = true;
switchD_001446dc_caseD_7:
    return bVar3;
  }
  uVar6 = (uint)bVar4;
  bVar4 = GetRange(unsigned_char)::type[uVar6];
  uVar7 = 0xffU >> (bVar4 & 0x1f) & uVar6;
  bVar3 = false;
  uVar8 = uVar7;
  if ((ulong)uVar6 - 0x90 < 0x30) {
    uVar8 = 0;
  }
  *codepoint = uVar8;
  switch(bVar4) {
  case 2:
    is->src_ = (Ch *)(pbVar2 + 2);
    *codepoint = pbVar2[1] & 0x3f | uVar7 << 6;
    return false;
  case 3:
    is->src_ = (Ch *)(pbVar2 + 2);
    bVar4 = pbVar2[1];
    uVar8 = bVar4 & 0x3f | uVar7 << 6;
    *codepoint = uVar8;
    bVar4 = bVar4 & 0xc0;
    break;
  case 4:
    is->src_ = (Ch *)(pbVar2 + 2);
    bVar4 = pbVar2[1];
    uVar8 = bVar4 & 0x3f | uVar7 << 6;
    *codepoint = uVar8;
    bVar4 = bVar4 & 0xe0;
    break;
  case 5:
    is->src_ = (Ch *)(pbVar2 + 2);
    bVar4 = pbVar2[1];
    uVar8 = bVar4 & 0x3f | uVar7 << 6;
    *codepoint = uVar8;
    is->src_ = (Ch *)(pbVar2 + 3);
    bVar5 = pbVar2[2];
    uVar8 = bVar5 & 0x3f | uVar8 << 6;
    *codepoint = uVar8;
    bVar5 = (bVar4 & 0xf0) + 0x80 | (bVar5 & 0xc0) + 0x80;
    is->src_ = (Ch *)(pbVar2 + 4);
    bVar4 = pbVar2[3];
    uVar8 = bVar4 & 0x3f | uVar8 << 6;
    goto LAB_001448cc;
  case 6:
    is->src_ = (Ch *)(pbVar2 + 2);
    bVar4 = pbVar2[1];
    uVar8 = bVar4 & 0x3f | uVar7 << 6;
    *codepoint = uVar8;
    is->src_ = (Ch *)(pbVar2 + 3);
    bVar5 = pbVar2[2];
    uVar8 = bVar5 & 0x3f | uVar8 << 6;
    *codepoint = uVar8;
    bVar5 = (bVar5 & 0xc0) + 0x80 | (bVar4 & 0xc0) + 0x80;
    is->src_ = (Ch *)(pbVar2 + 4);
    bVar4 = pbVar2[3];
    uVar8 = bVar4 & 0x3f | uVar8 << 6;
LAB_001448cc:
    *codepoint = uVar8;
    return (bVar4 & 0xc0) == 0x80 && bVar5 == 0;
  default:
    goto switchD_001446dc_caseD_7;
  case 10:
    is->src_ = (Ch *)(pbVar2 + 2);
    bVar4 = pbVar2[1];
    uVar8 = bVar4 & 0x3f | uVar7 << 6;
    *codepoint = uVar8;
    is->src_ = (Ch *)(pbVar2 + 3);
    bVar5 = pbVar2[2];
    *codepoint = bVar5 & 0x3f | uVar8 << 6;
    return (bVar4 & 0xe0) == 0xa0 && (bVar5 & 0xc0) == 0x80;
  case 0xb:
    is->src_ = (Ch *)(pbVar2 + 2);
    bVar4 = pbVar2[1];
    uVar8 = bVar4 & 0x3f | uVar7 << 6;
    *codepoint = uVar8;
    is->src_ = (Ch *)(pbVar2 + 3);
    bVar5 = pbVar2[2];
    uVar8 = bVar5 & 0x3f | uVar8 << 6;
    *codepoint = uVar8;
    is->src_ = (Ch *)(pbVar2 + 4);
    bVar1 = pbVar2[3];
    *codepoint = bVar1 & 0x3f | uVar8 << 6;
    return ((bVar1 & 0xc0) == 0x80 && (bVar5 & 0xc0) == 0x80) && (ulong)bVar4 - 0x90 < 0x30;
  }
  is->src_ = (Ch *)(pbVar2 + 3);
  bVar5 = pbVar2[2];
  *codepoint = bVar5 & 0x3f | uVar8 << 6;
  return (bVar5 & 0xc0) == 0x80 && bVar4 == 0x80;
}

Assistant:

Ch Take() { return *src_++; }